

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchCommon.hpp
# Opt level: O0

void readEntry<std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string*>>
               (_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                *iter,double *val)

{
  reference __str;
  double dVar1;
  _Self local_38;
  double *local_18;
  double *val_local;
  _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *iter_local;
  
  local_18 = val;
  val_local = (double *)iter;
  std::
  _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::operator++(&local_38,iter,0);
  __str = std::
          _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          ::operator*(&local_38);
  dVar1 = std::__cxx11::stod(__str,(size_t *)0x0);
  *local_18 = dVar1;
  return;
}

Assistant:

void readEntry(StringListIterator &iter, double &val){
    val = std::stod(*iter++);
}